

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O1

void __thiscall Refal2::CSetBuilder<unsigned_int>::Reset(CSetBuilder<unsigned_int> *this)

{
  this->fullSetStatus = S_Thru;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *)this);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->no)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&(this->thru)._M_t);
  return;
}

Assistant:

void CSetBuilder<T>::Reset()
{
	fullSetStatus = S_Thru;
	yes.clear();
	no.clear();
	thru.clear();
}